

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O3

int __thiscall
jrtplib::RTPSources::ObtainSourceDataInstance
          (RTPSources *this,uint32_t ssrc,RTPInternalSourceData **srcdat,bool *created)

{
  RTPMemoryManager *pRVar1;
  _func_int **pp_Var2;
  HashElement *pHVar3;
  RTPInternalSourceData *this_00;
  HashElement *pHVar4;
  uint uVar5;
  
  uVar5 = ssrc % 0x207d;
  pHVar4 = (this->sourcelist).table[uVar5];
  (this->sourcelist).curhashelem = pHVar4;
  while( true ) {
    if (pHVar4 == (HashElement *)0x0) {
      pRVar1 = (this->super_RTPMemoryObject).mgr;
      if (pRVar1 == (RTPMemoryManager *)0x0) {
        this_00 = (RTPInternalSourceData *)operator_new(0x280);
      }
      else {
        this_00 = (RTPInternalSourceData *)(**(code **)(*(long *)pRVar1 + 0x10))(pRVar1,0x280,0x18);
      }
      RTPInternalSourceData::RTPInternalSourceData
                (this_00,ssrc,this->probationtype,(this->super_RTPMemoryObject).mgr);
      pHVar4 = (this->sourcelist).table[uVar5];
      while( true ) {
        if (pHVar4 == (HashElement *)0x0) {
          pRVar1 = (this->sourcelist).super_RTPMemoryObject.mgr;
          if (pRVar1 == (RTPMemoryManager *)0x0) {
            pHVar4 = (HashElement *)operator_new(0x30);
          }
          else {
            pHVar4 = (HashElement *)
                     (**(code **)(*(long *)pRVar1 + 0x10))
                               (pRVar1,0x30,(this->sourcelist).memorytype);
          }
          pHVar4->key = ssrc;
          pHVar4->element = this_00;
          pHVar4->hashprev = (HashElement *)0x0;
          pHVar4->hashnext = (HashElement *)0x0;
          pHVar4->listprev = (HashElement *)0x0;
          pHVar4->listnext = (HashElement *)0x0;
          pHVar4->hashindex = uVar5;
          pHVar3 = (this->sourcelist).table[uVar5];
          (this->sourcelist).table[uVar5] = pHVar4;
          pHVar4->hashnext = pHVar3;
          if (pHVar3 != (HashElement *)0x0) {
            pHVar3->hashprev = pHVar4;
          }
          if ((this->sourcelist).firsthashelem == (HashElement *)0x0) {
            (this->sourcelist).firsthashelem = pHVar4;
          }
          else {
            pHVar3 = (this->sourcelist).lasthashelem;
            pHVar3->listnext = pHVar4;
            pHVar4->listprev = pHVar3;
          }
          (this->sourcelist).lasthashelem = pHVar4;
          *srcdat = this_00;
          *created = true;
          this->totalcount = this->totalcount + 1;
          return 0;
        }
        if (pHVar4->key == ssrc) break;
        pHVar4 = pHVar4->hashnext;
      }
      pRVar1 = (this->super_RTPMemoryObject).mgr;
      pp_Var2 = (this_00->super_RTPSourceData).super_RTPMemoryObject._vptr_RTPMemoryObject;
      if (pRVar1 == (RTPMemoryManager *)0x0) {
        (*pp_Var2[1])(this_00);
      }
      else {
        (**pp_Var2)(this_00);
        (**(code **)(*(long *)pRVar1 + 0x18))(pRVar1,this_00);
      }
      return -9;
    }
    if (pHVar4->key == ssrc) break;
    pHVar4 = pHVar4->hashnext;
    (this->sourcelist).curhashelem = pHVar4;
  }
  *srcdat = pHVar4->element;
  *created = false;
  return 0;
}

Assistant:

int RTPSources::ObtainSourceDataInstance(uint32_t ssrc,RTPInternalSourceData **srcdat,bool *created)
{
	RTPInternalSourceData *srcdat2;
	int status;
	
	if (sourcelist.GotoElement(ssrc) < 0) // No entry for this source
	{
#ifdef RTP_SUPPORT_PROBATION
		srcdat2 = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPINTERNALSOURCEDATA) RTPInternalSourceData(ssrc,probationtype,GetMemoryManager());
#else
		srcdat2 = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPINTERNALSOURCEDATA) RTPInternalSourceData(ssrc,RTPSources::NoProbation,GetMemoryManager());
#endif // RTP_SUPPORT_PROBATION
		if (srcdat2 == 0)
			return ERR_RTP_OUTOFMEM;
		if ((status = sourcelist.AddElement(ssrc,srcdat2)) < 0)
		{
			RTPDelete(srcdat2,GetMemoryManager());
			return status;
		}
		*srcdat = srcdat2;
		*created = true;
		totalcount++;
	}
	else
	{
		*srcdat = sourcelist.GetCurrentElement();
		*created = false;
	}
	return 0;
}